

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::ItemAdd(ImRect *bb,ImGuiID id,ImRect *nav_bb_arg)

{
  int *piVar1;
  ImGuiItemStatusFlags *pIVar2;
  ImRect *pIVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ImGuiID IVar7;
  uint uVar8;
  ImGuiNavLayer IVar9;
  ImGuiWindow *pIVar10;
  ImGuiWindow *pIVar11;
  ImVec2 IVar12;
  ImGuiContext *pIVar13;
  bool bVar14;
  bool bVar15;
  ImGuiContext *g;
  ImGuiNavMoveResult *result;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  
  pIVar13 = GImGui;
  pIVar10 = GImGui->CurrentWindow;
  if (id != 0) {
    piVar1 = &(pIVar10->DC).NavLayerActiveMaskNext;
    *piVar1 = *piVar1 | (pIVar10->DC).NavLayerCurrentMask;
    IVar7 = pIVar13->NavId;
    if ((((IVar7 == id) || (pIVar13->NavAnyRequest == true)) &&
        (pIVar11 = pIVar13->NavWindow, pIVar11->RootWindowForNav == pIVar10->RootWindowForNav)) &&
       ((pIVar10 == pIVar11 || (((uint)(pIVar11->Flags | pIVar10->Flags) >> 0x17 & 1) != 0)))) {
      if (nav_bb_arg == (ImRect *)0x0) {
        nav_bb_arg = bb;
      }
      uVar8 = (pIVar10->DC).ItemFlags;
      fVar16 = (pIVar10->Pos).x;
      fVar20 = (nav_bb_arg->Min).x - fVar16;
      fVar17 = (pIVar10->Pos).y;
      fVar21 = (nav_bb_arg->Min).y - fVar17;
      fVar16 = (nav_bb_arg->Max).x - fVar16;
      fVar17 = (nav_bb_arg->Max).y - fVar17;
      if ((pIVar13->NavInitRequest == true) && (pIVar13->NavLayer == (pIVar10->DC).NavLayerCurrent))
      {
        if ((uVar8 & 0x10) == 0) {
          pIVar13->NavInitResultId = id;
          (pIVar13->NavInitResultRectRel).Min.x = fVar20;
          (pIVar13->NavInitResultRectRel).Min.y = fVar21;
          (pIVar13->NavInitResultRectRel).Max.x = fVar16;
          (pIVar13->NavInitResultRectRel).Max.y = fVar17;
          pIVar13->NavInitRequest = false;
          pIVar13->NavAnyRequest = pIVar13->NavMoveRequest;
        }
        else if (pIVar13->NavInitResultId == 0) {
          pIVar13->NavInitResultId = id;
          (pIVar13->NavInitResultRectRel).Min.x = fVar20;
          (pIVar13->NavInitResultRectRel).Min.y = fVar21;
          (pIVar13->NavInitResultRectRel).Max.x = fVar16;
          (pIVar13->NavInitResultRectRel).Max.y = fVar17;
        }
      }
      if (((IVar7 != id) || ((pIVar13->NavMoveRequestFlags & 0x10) != 0)) && ((uVar8 & 8) == 0)) {
        result = &pIVar13->NavMoveResultOther;
        if (pIVar10 == pIVar11) {
          result = &pIVar13->NavMoveResultLocal;
        }
        if ((pIVar13->NavMoveRequest == true) && (bVar14 = NavScoreItem(result,*nav_bb_arg), bVar14)
           ) {
          result->ID = id;
          result->Window = pIVar10;
          (result->RectRel).Min.x = fVar20;
          (result->RectRel).Min.y = fVar21;
          (result->RectRel).Max.x = fVar16;
          (result->RectRel).Max.y = fVar17;
        }
        if (((pIVar13->NavMoveRequestFlags & 0x20) != 0) &&
           (bVar14 = ImRect::Overlaps(&pIVar10->ClipRect,nav_bb_arg), bVar14)) {
          fVar4 = (nav_bb_arg->Min).y;
          fVar5 = (nav_bb_arg->Max).y;
          fVar6 = (pIVar10->ClipRect).Min.y;
          fVar18 = (pIVar10->ClipRect).Max.y;
          fVar19 = fVar18;
          if (fVar5 <= fVar18) {
            fVar19 = fVar5;
          }
          if (fVar4 <= fVar18) {
            fVar18 = fVar4;
          }
          if (((fVar5 - fVar4) * 0.7 <=
               (float)(-(uint)(fVar5 < fVar6) & (uint)fVar6 | ~-(uint)(fVar5 < fVar6) & (uint)fVar19
                      ) -
               (float)(-(uint)(fVar4 < fVar6) & (uint)fVar6 | ~-(uint)(fVar4 < fVar6) & (uint)fVar18
                      )) &&
             (bVar14 = NavScoreItem(&pIVar13->NavMoveResultLocalVisibleSet,*nav_bb_arg), bVar14)) {
            (pIVar13->NavMoveResultLocalVisibleSet).ID = id;
            (pIVar13->NavMoveResultLocalVisibleSet).Window = pIVar10;
            (pIVar13->NavMoveResultLocalVisibleSet).RectRel.Min.x = fVar20;
            (pIVar13->NavMoveResultLocalVisibleSet).RectRel.Min.y = fVar21;
            (pIVar13->NavMoveResultLocalVisibleSet).RectRel.Max.x = fVar16;
            (pIVar13->NavMoveResultLocalVisibleSet).RectRel.Max.y = fVar17;
          }
        }
      }
      if (pIVar13->NavId == id) {
        pIVar13->NavWindow = pIVar10;
        IVar9 = (pIVar10->DC).NavLayerCurrent;
        pIVar13->NavLayer = IVar9;
        pIVar13->NavIdIsAlive = true;
        pIVar13->NavIdTabCounter = pIVar10->FocusIdxTabCounter;
        pIVar3 = pIVar10->NavRectRel + IVar9;
        (pIVar3->Min).x = fVar20;
        (pIVar3->Min).y = fVar21;
        (pIVar3->Max).x = fVar16;
        (pIVar3->Max).y = fVar17;
      }
    }
  }
  (pIVar10->DC).LastItemId = id;
  IVar12 = bb->Max;
  (pIVar10->DC).LastItemRect.Min = bb->Min;
  (pIVar10->DC).LastItemRect.Max = IVar12;
  (pIVar10->DC).LastItemStatusFlags = 0;
  bVar14 = IsClippedEx(bb,id,false);
  if ((!bVar14) && (bVar15 = IsMouseHoveringRect(&bb->Min,&bb->Max,true), bVar15)) {
    pIVar2 = &(pIVar10->DC).LastItemStatusFlags;
    *(byte *)pIVar2 = (byte)*pIVar2 | 1;
  }
  return !bVar14;
}

Assistant:

bool ImGui::ItemAdd(const ImRect& bb, ImGuiID id, const ImRect* nav_bb_arg)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (id != 0)
    {
        // Navigation processing runs prior to clipping early-out
        //  (a) So that NavInitRequest can be honored, for newly opened windows to select a default widget
        //  (b) So that we can scroll up/down past clipped items. This adds a small O(N) cost to regular navigation requests unfortunately, but it is still limited to one window.
        //      it may not scale very well for windows with ten of thousands of item, but at least NavMoveRequest is only set on user interaction, aka maximum once a frame.
        //      We could early out with "if (is_clipped && !g.NavInitRequest) return false;" but when we wouldn't be able to reach unclipped widgets. This would work if user had explicit scrolling control (e.g. mapped on a stick)
        window->DC.NavLayerActiveMaskNext |= window->DC.NavLayerCurrentMask;
        if (g.NavId == id || g.NavAnyRequest)
            if (g.NavWindow->RootWindowForNav == window->RootWindowForNav)
                if (window == g.NavWindow || ((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened))
                    NavProcessItem(window, nav_bb_arg ? *nav_bb_arg : bb, id);
    }

    window->DC.LastItemId = id;
    window->DC.LastItemRect = bb;
    window->DC.LastItemStatusFlags = ImGuiItemStatusFlags_None;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0)
        ImGuiTestEngineHook_ItemAdd(&g, bb, id);
#endif

    // Clipping test
    const bool is_clipped = IsClippedEx(bb, id, false);
    if (is_clipped)
        return false;
    //if (g.IO.KeyAlt) window->DrawList->AddRect(bb.Min, bb.Max, IM_COL32(255,255,0,120)); // [DEBUG]

    // We need to calculate this now to take account of the current clipping rectangle (as items like Selectable may change them)
    if (IsMouseHoveringRect(bb.Min, bb.Max))
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_HoveredRect;
    return true;
}